

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestReadSome(void)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  size_t in;
  size_t bytesAvail;
  char *local_1718;
  char *local_1710;
  const_string local_1708;
  const_string local_16f8;
  undefined **local_16e8;
  undefined1 local_16e0;
  undefined8 *local_16d8;
  char *local_16d0;
  string junk;
  ostream os;
  istream is;
  char datain [5000];
  
  is.super_istream._vptr_basic_istream = (_func_int **)anon_var_dwarf_8f9cc;
  is.super_istream._M_gcount =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  is.super_istream._16_8_ = 0x1f8;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&is);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  os.super_ostream._vptr_basic_ostream._0_1_ = 1;
  datain[8] = '\0';
  datain._0_8_ = &PTR__lazy_ostream_001eab08;
  datain._16_8_ = &boost::unit_test::lazy_ostream::inst;
  datain._24_8_ = anon_var_dwarf_90d58;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&os,(lazy_ostream *)datain);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&os);
  makeString_abi_cxx11_(&junk,0x800);
  avro::ostream::ostream(&os);
  iVar3 = 5;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    std::operator<<(&os.super_ostream,(string *)&junk);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Buffer has ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," bytes\n");
  avro::istream::istream(&is,(OutputBuffer *)&os.super_ostream.field_0x48);
  while( true ) {
    lVar2 = std::streambuf::in_avail();
    if (lVar2 == 0) break;
    bytesAvail = std::streambuf::in_avail();
    poVar1 = std::operator<<((ostream *)&std::cout,"Bytes avail = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    in = std::istream::readsome((char *)&is,(long)datain);
    poVar1 = std::operator<<((ostream *)&std::cout,"Bytes read = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    local_16f8.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_16f8.m_end = "";
    local_1708.m_begin = "";
    local_1708.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)poVar1,&local_16f8,0x20f,&local_1708);
    local_16e0 = 0;
    local_16e8 = &PTR__lazy_ostream_001ea848;
    local_16d8 = &boost::unit_test::lazy_ostream::inst;
    local_16d0 = "";
    local_1718 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_1710 = "";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_16e8,&local_1718,0x20f,1,2,&bytesAvail,"bytesAvail",&in,"in");
  }
  avro::istream::~istream(&is);
  avro::ostream::~ostream(&os);
  std::__cxx11::string::~string((string *)&junk);
  return;
}

Assistant:

void TestReadSome()
{
    BOOST_TEST_MESSAGE( "TestReadSome");
    {
        std::string junk = makeString(kDefaultBlockSize/2);

        ostream os;

        // write enough bytes to a buffer, to create at least 3 blocks
        int i = 0;
        for(; i < 5; ++i) {
            os << junk;
        }

        cout << "Buffer has " << os.getBuffer().size() << " bytes\n";

        istream is(os.getBuffer());

        char datain[5000];

        while(is.rdbuf()->in_avail()) {
            size_t bytesAvail = static_cast<size_t>(is.rdbuf()->in_avail());
            cout << "Bytes avail = " << bytesAvail << endl;
            size_t in = static_cast<size_t>(is.readsome(datain, sizeof(datain)));
            cout << "Bytes read = " << in << endl;
            BOOST_CHECK_EQUAL(bytesAvail, in);
        }
    }
}